

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clump.cpp
# Opt level: O2

Atomic * rw::Atomic::streamReadClump(Stream *stream,FrameList_ *frameList,Geometry **geometryList)

{
  FILE *pFVar1;
  bool bVar2;
  Atomic *this;
  Geometry *geo;
  char *pcVar3;
  uint32 version;
  int32 buf [4];
  Error _e_1;
  
  bVar2 = findChunk(stream,1,(uint32 *)0x0,&version);
  if (!bVar2) {
    buf[0] = 2;
    buf[1] = -0x7ffffffc;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/clump.cpp",0x207);
    pFVar1 = _stderr;
    pcVar3 = dbgsprint(0x80000004,"STRUCT");
    fprintf(pFVar1,"%s\n",pcVar3);
    setError((Error *)buf);
    return (Atomic *)0x0;
  }
  Stream::read32(stream,buf,(uint)(0x303ff < version) * 4 + 0xc);
  this = create();
  if (this == (Atomic *)0x0) {
    return (Atomic *)0x0;
  }
  setFrame(this,frameList->frames[buf[0]]);
  if (version < 0x30400) {
    bVar2 = findChunk(stream,0xf,(uint32 *)0x0,(uint32 *)0x0);
    if (!bVar2) {
      _e_1.plugin = 2;
      _e_1.code = 0x80000004;
      fprintf(_stderr,"%s:%d: ",
              "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/clump.cpp",0x212);
      pFVar1 = _stderr;
      pcVar3 = dbgsprint(0x80000004,"STRUCT");
      fprintf(pFVar1,"%s\n",pcVar3);
      setError(&_e_1);
      goto LAB_0012972e;
    }
    geo = Geometry::streamRead(stream);
    if (geo == (Geometry *)0x0) goto LAB_0012972e;
    setGeometry(this,geo,0);
    Geometry::destroy(geo);
  }
  else {
    setGeometry(this,geometryList[buf[1]],0);
  }
  (this->object).object.flags = (uint8)buf[2];
  atomicRights = 0;
  bVar2 = PluginList::streamRead((PluginList *)&s_plglist,stream,this);
  if (bVar2) {
    if (atomicRights != 0) {
      PluginList::assertRights((PluginList *)&s_plglist,this,atomicRights,DAT_00143c8c);
      return this;
    }
    return this;
  }
LAB_0012972e:
  destroy(this);
  return (Atomic *)0x0;
}

Assistant:

Atomic*
Atomic::streamReadClump(Stream *stream,
                        FrameList_ *frameList, Geometry **geometryList)
{
	int32 buf[4];
	uint32 version;
	if(!findChunk(stream, ID_STRUCT, nil, &version)){
		RWERROR((ERR_CHUNK, "STRUCT"));
		return nil;
	}
	stream->read32(buf, version < 0x30400 ? 12 : 16);
	Atomic *atomic = Atomic::create();
	if(atomic == nil)
		return nil;
	atomic->setFrame(frameList->frames[buf[0]]);
	Geometry *g;
	if(version < 0x30400){
		if(!findChunk(stream, ID_GEOMETRY, nil, nil)){
			RWERROR((ERR_CHUNK, "STRUCT"));
			goto fail;
		}
		g = Geometry::streamRead(stream);
		if(g == nil)
			goto fail;
		atomic->setGeometry(g, 0);
		g->destroy();
	}else
		atomic->setGeometry(geometryList[buf[1]], 0);
	atomic->object.object.flags = buf[2];

	atomicRights[0] = 0;
	if(!s_plglist.streamRead(stream, atomic))
		goto fail;
	if(atomicRights[0])
		s_plglist.assertRights(atomic, atomicRights[0], atomicRights[1]);
	return atomic;

fail:
	atomic->destroy();
	return nil;
}